

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O1

bool __thiscall units::fixed_measurement::operator<(fixed_measurement *this,measurement *val)

{
  bool bVar1;
  double dVar2;
  unit local_20;
  
  local_20 = val->units_;
  bVar1 = unit::operator==(&this->units_,&local_20);
  if (bVar1) {
    dVar2 = val->value_;
  }
  else {
    dVar2 = measurement::value_as(val,&this->units_);
  }
  return this->value_ <= dVar2 && dVar2 != this->value_;
}

Assistant:

bool operator<(const measurement& val) const
    {
        return operator<(
            (units_ == val.units()) ? val.value() : val.value_as(units_));
    }